

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layer_conv.cpp
# Opt level: O1

ImageVolume * __thiscall
LayerConv::mat2img(ImageVolume *__return_storage_ptr__,LayerConv *this,MatrixXd *conv_mat,
                  LayerSize *output_size)

{
  ulong cols;
  ulong rows;
  double *pdVar1;
  long lVar2;
  long lVar3;
  undefined8 *puVar4;
  ulong uVar5;
  long lVar6;
  ulong size;
  Image output_img;
  MatrixXd img_channel;
  vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  local_98;
  double *local_80;
  ulong local_78;
  undefined8 local_70;
  MatrixXd *local_68;
  ulong local_60;
  long local_58;
  long local_50;
  DenseStorage<double,__1,__1,__1,_0> local_48;
  
  cols = output_size->rows;
  rows = output_size->cols;
  (__return_storage_ptr__->
  super__Vector_base<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (0 < (conv_mat->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
          m_rows) {
    size = rows * cols;
    uVar5 = 0;
    do {
      local_98.
      super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_98.
      super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_98.
      super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      lVar3 = (conv_mat->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage
              .m_cols;
      if (0 < lVar3) {
        lVar6 = 0;
        do {
          pdVar1 = (conv_mat->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                   m_storage.m_data;
          lVar2 = (conv_mat->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                  m_storage.m_rows;
          local_80 = pdVar1 + uVar5 + lVar2 * lVar6;
          local_70 = 1;
          local_78 = size;
          if (pdVar1 != (double *)0x0 && (long)size < 0) {
            __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/jin-qin[P]cppcnn/src/cppcnn/../../3rdparty/Eigen/src/Core/MapBase.h"
                          ,0xb0,
                          "Eigen::MapBase<Eigen::Block<const Eigen::Matrix<double, -1, -1>>>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<const Eigen::Matrix<double, -1, -1>>, Level = 0]"
                         );
          }
          local_68 = conv_mat;
          local_60 = uVar5;
          local_58 = lVar6;
          local_50 = lVar2;
          if ((((long)(uVar5 | size) < 0) || (lVar3 <= lVar6)) ||
             ((long)(lVar2 - size) < (long)uVar5)) {
            __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/jin-qin[P]cppcnn/src/cppcnn/../../3rdparty/Eigen/src/Core/Block.h"
                          ,0x93,
                          "Eigen::Block<const Eigen::Matrix<double, -1, -1>>::Block(XprType &, Index, Index, Index, Index) [XprType = const Eigen::Matrix<double, -1, -1>, BlockRows = -1, BlockCols = -1, InnerPanel = false]"
                         );
          }
          Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
          PlainObjectBase<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,_1,_1,false>>
                    ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_48,
                     (DenseBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_>
                      *)&local_80);
          if ((long)(rows | cols) < 0) {
            __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/jin-qin[P]cppcnn/src/cppcnn/../../3rdparty/Eigen/src/Core/PlainObjectBase.h"
                          ,0x11d,
                          "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, -1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, -1>]"
                         );
          }
          if ((cols != 0 && rows != 0) &&
             (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / SEXT816((long)cols),0) <
              (long)rows)) {
            puVar4 = (undefined8 *)__cxa_allocate_exception(8);
            *puVar4 = operator_delete;
            __cxa_throw(puVar4,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
          }
          Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_48,size,rows,cols);
          Eigen::internal::
          inplace_transpose_selector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_false,_false>::run
                    ((Matrix<double,__1,__1,_0,__1,__1> *)&local_48);
          std::
          vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
          ::push_back(&local_98,(value_type *)&local_48);
          free(local_48.m_data);
          lVar6 = lVar6 + 1;
          lVar3 = (conv_mat->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                  m_storage.m_cols;
        } while (lVar6 < lVar3);
      }
      std::
      vector<std::vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>_>_>
      ::push_back(__return_storage_ptr__,&local_98);
      std::
      vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
      ::~vector(&local_98);
      uVar5 = (ulong)((int)uVar5 + (int)size);
    } while ((long)uVar5 <
             (conv_mat->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
             m_rows);
  }
  return __return_storage_ptr__;
}

Assistant:

ImageVolume LayerConv::mat2img(const Eigen::MatrixXd& conv_mat, const LayerSize& output_size) {
	auto rows = output_size.rows;
	auto cols = output_size.cols;
	auto opt_img_sz = rows * cols; // output image size.

	ImageVolume output_volume;
	for (auto img_ind = 0; img_ind < conv_mat.rows(); img_ind += opt_img_sz) {
		Image output_img;
		for (auto c = 0; c < conv_mat.cols(); c++) {
			MatrixXd img_channel = conv_mat.block(img_ind, c, opt_img_sz, 1);
			img_channel.resize(cols, rows);
			img_channel.transposeInPlace();

			output_img.push_back(img_channel);
		}

		output_volume.push_back(output_img);
	}
	
	return output_volume;
}